

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

String * __thiscall
Diligent::GetTextureComponentMappingString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,TextureComponentMapping *Mapping)

{
  size_t Comp;
  long lVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  lVar1 = 0;
  do {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  return __return_storage_ptr__;
}

Assistant:

String GetTextureComponentMappingString(const TextureComponentMapping& Mapping)
{
    static_assert(TEXTURE_COMPONENT_SWIZZLE_IDENTITY == 0, "TEXTURE_COMPONENT_SWIZZLE_IDENTITY == 0 is assumed below");
    static_assert(TEXTURE_COMPONENT_SWIZZLE_ZERO == 1, "TEXTURE_COMPONENT_SWIZZLE_ZERO == 1 is assumed below");
    static_assert(TEXTURE_COMPONENT_SWIZZLE_ONE == 2, "TEXTURE_COMPONENT_SWIZZLE_ONE == 2 is assumed below");
    static_assert(TEXTURE_COMPONENT_SWIZZLE_R == 3, "TEXTURE_COMPONENT_SWIZZLE_R == 3 is assumed below");
    static_assert(TEXTURE_COMPONENT_SWIZZLE_G == 4, "TEXTURE_COMPONENT_SWIZZLE_G == 4 is assumed below");
    static_assert(TEXTURE_COMPONENT_SWIZZLE_B == 5, "TEXTURE_COMPONENT_SWIZZLE_B == 5 is assumed below");
    static_assert(TEXTURE_COMPONENT_SWIZZLE_A == 6, "TEXTURE_COMPONENT_SWIZZLE_A == 6 is assumed below");
    String Str;
    Str.reserve(4);
    for (size_t Comp = 0; Comp < 4; ++Comp)
    {
        TEXTURE_COMPONENT_SWIZZLE ComponentSwizzle = Mapping[Comp];
        if (ComponentSwizzle == TEXTURE_COMPONENT_SWIZZLE_IDENTITY)
            Str += "rgba"[Comp];
        else
            Str += "_01rgba"[ComponentSwizzle];
    }
    return Str;
}